

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemorySSA.cpp
# Opt level: O2

RWNode * __thiscall
dg::dda::MemorySSATransformation::insertUse
          (MemorySSATransformation *this,RWNode *where,RWNode *mem,Offset *off,Offset *len)

{
  RWNode *n;
  GenericDefSite<dg::dda::RWNode> local_40;
  
  n = ReadWriteGraph::create(&(this->super_DataDependenceAnalysisImpl).graph,MU);
  local_40.offset = (Offset)off->offset;
  local_40.len = (Offset)len->offset;
  local_40.target = mem;
  std::
  _Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
  ::_M_insert_unique<dg::dda::GenericDefSite<dg::dda::RWNode>const&>
            ((_Rb_tree<dg::dda::GenericDefSite<dg::dda::RWNode>,dg::dda::GenericDefSite<dg::dda::RWNode>,std::_Identity<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::less<dg::dda::GenericDefSite<dg::dda::RWNode>>,std::allocator<dg::dda::GenericDefSite<dg::dda::RWNode>>>
              *)&(n->annotations).uses,&local_40);
  SubgraphNode<dg::dda::RWNode>::insertBefore(&n->super_SubgraphNode<dg::dda::RWNode>,where);
  BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>::insertBefore
            (&where->bblock->super_BBlockBase<dg::dda::RWBBlock,_dg::dda::RWNode>,n,where);
  return n;
}

Assistant:

RWNode *MemorySSATransformation::insertUse(RWNode *where, RWNode *mem,
                                           const Offset &off,
                                           const Offset &len) {
    // DBG_SECTION_BEGIN(dda, "Adding MU node");
    auto &use = graph.create(RWNodeType::MU);
    use.addUse({mem, off, len});
    use.insertBefore(where);
    where->getBBlock()->insertBefore(&use, where);
    // DBG_SECTION_END(dda, "Created MU node " << use->getID());

    return &use;
}